

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void * AllocUnits(CPpmd7 *p,uint indx)

{
  byte bVar1;
  CPpmd_Void_Ref CVar2;
  uint uVar3;
  void *retVal;
  uint oldIndx;
  long lVar4;
  Byte *pBVar5;
  ulong uVar6;
  CPpmd_Void_Ref *pCVar7;
  uint uVar8;
  uint uVar9;
  Byte *pBVar10;
  ulong uVar11;
  
  uVar6 = (ulong)p->FreeList[indx];
  if (uVar6 != 0) {
    pBVar5 = p->Base;
    p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar5 + uVar6);
    return pBVar5 + uVar6;
  }
  lVar4 = (ulong)p->Indx2Units[indx] * 0xc;
  pBVar5 = p->LoUnit;
  if ((uint)lVar4 <= (uint)(*(int *)&p->HiUnit - (int)pBVar5)) {
    p->LoUnit = pBVar5 + lVar4;
    return pBVar5;
  }
  oldIndx = indx;
  if (p->GlueCount == 0) {
    uVar3 = p->Size + p->AlignOffset;
    p->GlueCount = 0xff;
    lVar4 = 0;
    uVar8 = uVar3;
    do {
      bVar1 = p->Indx2Units[lVar4];
      CVar2 = p->FreeList[lVar4];
      p->FreeList[lVar4] = 0;
      if (CVar2 != 0) {
        pBVar5 = p->Base;
        uVar9 = uVar8;
        do {
          uVar8 = CVar2;
          *(uint *)(pBVar5 + (ulong)uVar8 + 4) = uVar9;
          *(uint *)(pBVar5 + (ulong)uVar9 + 8) = uVar8;
          CVar2 = *(CPpmd_Void_Ref *)(pBVar5 + uVar8);
          (pBVar5 + uVar8)[0] = '\0';
          (pBVar5 + uVar8)[1] = '\0';
          *(ushort *)(pBVar5 + (ulong)uVar8 + 2) = (ushort)bVar1;
          uVar9 = uVar8;
        } while (CVar2 != 0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x26);
    pBVar5 = p->Base;
    (pBVar5 + uVar3)[0] = '\x01';
    (pBVar5 + uVar3)[1] = '\0';
    *(uint *)(pBVar5 + (ulong)uVar3 + 4) = uVar8;
    *(uint *)(pBVar5 + (ulong)uVar8 + 8) = uVar3;
    pBVar10 = p->LoUnit;
    if (pBVar10 != p->HiUnit) {
      pBVar10[0] = '\x01';
      pBVar10[1] = '\0';
    }
    while (uVar8 != uVar3) {
      uVar6 = (ulong)uVar8;
      uVar11 = (ulong)*(ushort *)(pBVar5 + uVar6 + 2);
      uVar8 = (uint)*(ushort *)(pBVar5 + uVar11 * 0xc + uVar6 + 2) +
              (uint)*(ushort *)(pBVar5 + uVar6 + 2);
      if (uVar8 < 0x10000 && *(short *)(pBVar5 + uVar11 * 0xc + uVar6) == 0) {
        pBVar10 = pBVar5 + uVar11 * 0xc + uVar6;
        do {
          uVar9 = *(uint *)(pBVar10 + 8);
          *(undefined4 *)(pBVar5 + (ulong)uVar9 + 4) = *(undefined4 *)(pBVar10 + 4);
          *(uint *)(pBVar5 + (ulong)*(uint *)(pBVar10 + 4) + 8) = uVar9;
          *(short *)(pBVar5 + uVar6 + 2) = (short)uVar8;
          if (*(short *)(pBVar5 + (ulong)uVar8 * 0xc + uVar6) != 0) break;
          pBVar10 = pBVar5 + (ulong)uVar8 * 0xc + uVar6;
          uVar8 = uVar8 + *(ushort *)(pBVar10 + 2);
        } while (uVar8 < 0x10000);
      }
      uVar8 = *(uint *)(pBVar5 + uVar6 + 4);
    }
    uVar8 = *(uint *)(pBVar5 + (ulong)uVar3 + 4);
    while (uVar8 != uVar3) {
      uVar6 = (ulong)uVar8;
      uVar8 = *(uint *)(pBVar5 + uVar6 + 4);
      uVar9 = (uint)*(ushort *)(pBVar5 + uVar6 + 2);
      if (0x80 < *(ushort *)(pBVar5 + uVar6 + 2)) {
        do {
          *(CPpmd_Void_Ref *)(pBVar5 + uVar6) = p->FreeList[0x25];
          p->FreeList[0x25] = (CPpmd_Void_Ref)uVar6;
          uVar9 = uVar9 - 0x80;
          uVar6 = uVar6 + 0x600;
        } while (0x80 < uVar9);
      }
      pCVar7 = (CPpmd_Void_Ref *)(pBVar5 + uVar6);
      uVar6 = (ulong)p->Units2Indx[uVar9 - 1];
      if (uVar9 != p->Indx2Units[uVar6]) {
        uVar6 = (ulong)(p->Units2Indx[uVar9 - 1] - 1);
        bVar1 = p->Indx2Units[uVar6];
        uVar9 = uVar9 + ~(uint)bVar1;
        pCVar7[(ulong)bVar1 * 3] = p->FreeList[uVar9];
        p->FreeList[uVar9] = (int)(pCVar7 + (ulong)bVar1 * 3) - (int)pBVar5;
      }
      *pCVar7 = p->FreeList[uVar6];
      p->FreeList[uVar6] = (int)pCVar7 - (int)pBVar5;
    }
    uVar6 = (ulong)p->FreeList[indx];
    if (uVar6 != 0) {
      p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar5 + uVar6);
      return pBVar5 + uVar6;
    }
  }
  do {
    if (oldIndx == 0x25) {
      bVar1 = p->Indx2Units[indx];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar5 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar5;
        return pBVar5;
      }
      return (void *)0x0;
    }
    oldIndx = oldIndx + 1;
    uVar6 = (ulong)p->FreeList[oldIndx];
  } while (uVar6 == 0);
  pBVar5 = p->Base + uVar6;
  p->FreeList[oldIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar6);
  SplitBlock(p,pBVar5,oldIndx,indx);
  return pBVar5;
}

Assistant:

static void *AllocUnits(CPpmd8 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}